

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImGuiID *pIVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ImGuiID IVar4;
  int iVar5;
  ImGuiWindow *pIVar6;
  ImGuiShrinkWidthItem *pIVar7;
  char *__src;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  ImGuiID IVar12;
  ImGuiID IVar13;
  ImGuiID IVar14;
  ImGuiID IVar15;
  ImGuiContext *pIVar16;
  ImGuiContext *pIVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  int section_n;
  ImGuiTabItem *pIVar21;
  ImGuiTabItem *pIVar22;
  ImGuiShrinkWidthItem *__dest;
  ulong uVar23;
  char *__dest_00;
  long lVar24;
  uint uVar25;
  float *pfVar26;
  byte bVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  ulong uVar33;
  float *pfVar34;
  long lVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  ImVec2 IVar39;
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  float fVar44;
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  ImGuiTabBarSection sections [3];
  int shrink_buffer_indexes [3];
  ImVec4 arrow_col;
  float local_114;
  float local_fc [4];
  uint uStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined1 local_c8 [16];
  int local_ac [3];
  ImVec2 local_a0;
  undefined1 local_98 [16];
  ImVec4 local_88;
  undefined8 local_78;
  ulong local_70;
  undefined1 local_68 [16];
  ImVec4 local_58;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  
  pIVar17 = GImGui;
  tab_bar->WantLayout = false;
  local_e8 = 0;
  uStack_e0 = 0;
  local_fc[1] = 0.0;
  local_fc[2] = 0.0;
  stack0xffffffffffffff10 = 0;
  local_d8 = 0;
  uVar28 = (tab_bar->Tabs).Size;
  if ((int)uVar28 < 1) {
    bVar27 = 0;
    uVar32 = 0;
  }
  else {
    pIVar21 = (tab_bar->Tabs).Data;
    lVar24 = 0;
    uVar33 = 0;
    uVar23 = 0;
    bVar27 = 0;
    do {
      pIVar1 = (ImGuiID *)((long)&pIVar21->ID + lVar24);
      if ((*(int *)((long)&pIVar21->LastFrameVisible + lVar24) < tab_bar->PrevFrameVisible) ||
         ((&pIVar21->WantClose)[lVar24] == true)) {
        IVar4 = *pIVar1;
        if (tab_bar->VisibleTabId == IVar4) {
          tab_bar->VisibleTabId = 0;
        }
        if (tab_bar->SelectedTabId == IVar4) {
          tab_bar->SelectedTabId = 0;
        }
        if (tab_bar->NextSelectedTabId == IVar4) {
          tab_bar->NextSelectedTabId = 0;
        }
      }
      else {
        iVar31 = (int)uVar23;
        if (uVar33 != uVar23) {
          *(undefined8 *)((long)&pIVar21[iVar31].NameOffset + 1) =
               *(undefined8 *)((long)pIVar1 + 0x1d);
          IVar12 = pIVar1[0];
          IVar13 = pIVar1[1];
          IVar14 = pIVar1[2];
          IVar15 = pIVar1[3];
          fVar45 = (float)pIVar1[5];
          fVar38 = (float)pIVar1[6];
          IVar4 = pIVar1[7];
          pfVar26 = &pIVar21[iVar31].Offset;
          *pfVar26 = (float)pIVar1[4];
          pfVar26[1] = fVar45;
          pfVar26[2] = fVar38;
          pfVar26[3] = (float)IVar4;
          pIVar21 = pIVar21 + iVar31;
          pIVar21->ID = IVar12;
          pIVar21->Flags = IVar13;
          pIVar21->LastFrameVisible = IVar14;
          pIVar21->LastFrameSelected = IVar15;
          pIVar21 = (tab_bar->Tabs).Data;
        }
        pIVar21[iVar31].IndexDuringLayout = (ImS16)uVar23;
        uVar28 = pIVar21[iVar31].Flags;
        lVar35 = 0;
        if ((uVar28 & 0x40) == 0) {
          lVar35 = (ulong)((char)(byte)uVar28 < '\0') + 1;
        }
        if (0 < iVar31) {
          bVar27 = (pIVar21[uVar23 - 1].Flags & 0x40U) == 0 & (byte)uVar28 >> 6 | bVar27 |
                   ((uVar28 & 0xc0) != 0x80 && (pIVar21[uVar23 - 1].Flags & 0xc0U) == 0x80);
        }
        local_fc[lVar35 * 3 + 1] = (float)((int)local_fc[lVar35 * 3 + 1] + 1);
        uVar23 = (ulong)(iVar31 + 1);
        uVar28 = (tab_bar->Tabs).Size;
      }
      uVar32 = (uint)uVar23;
      uVar33 = uVar33 + 1;
      lVar24 = lVar24 + 0x28;
    } while ((long)uVar33 < (long)(int)uVar28);
  }
  if (uVar28 != uVar32) {
    iVar31 = (tab_bar->Tabs).Capacity;
    if (iVar31 < (int)uVar32) {
      if (iVar31 == 0) {
        uVar28 = 8;
      }
      else {
        uVar28 = iVar31 / 2 + iVar31;
      }
      if ((int)uVar28 <= (int)uVar32) {
        uVar28 = uVar32;
      }
      pIVar22 = (ImGuiTabItem *)MemAlloc((long)(int)uVar28 * 0x28);
      pIVar21 = (tab_bar->Tabs).Data;
      if (pIVar21 != (ImGuiTabItem *)0x0) {
        memcpy(pIVar22,pIVar21,(long)(tab_bar->Tabs).Size * 0x28);
        MemFree((tab_bar->Tabs).Data);
      }
      (tab_bar->Tabs).Data = pIVar22;
      (tab_bar->Tabs).Capacity = uVar28;
    }
    (tab_bar->Tabs).Size = uVar32;
  }
  if ((~bVar27 & 1) == 0 && 1 < uVar32) {
    qsort((tab_bar->Tabs).Data,(long)(int)uVar32,0x28,TabItemComparerBySection);
  }
  fVar45 = local_fc[1];
  iVar31 = (int)uStack_e0;
  uVar23 = uStack_e0 & 0xffffffff;
  local_fc[0] = 0.0;
  local_114 = 0.0;
  if (0 < (int)((int)uStack_e0 + uStack_ec) && 0 < (int)local_fc[1]) {
    local_fc[0] = (pIVar17->Style).ItemInnerSpacing.x;
  }
  stack0xffffffffffffff10 = CONCAT44(uStack_ec,local_fc[0]);
  local_70 = (ulong)uStack_ec;
  if (0 < (int)uStack_e0 && 0 < (int)uStack_ec) {
    local_114 = (pIVar17->Style).ItemInnerSpacing.x;
  }
  local_e8 = CONCAT44(local_114,(float)local_e8);
  fVar38 = (float)tab_bar->NextSelectedTabId;
  if (fVar38 != 0.0) {
    tab_bar->SelectedTabId = (ImGuiID)fVar38;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    bVar18 = TabBarProcessReorder(tab_bar);
    if ((bVar18) && (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)) {
      fVar38 = (float)tab_bar->ReorderRequestTabId;
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar16 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    local_c8._0_8_ = uVar23;
    pIVar6 = GImGui->CurrentWindow;
    fVar36 = (GImGui->Style).FramePadding.y;
    fVar44 = GImGui->FontSize;
    IVar39 = (pIVar6->DC).CursorPos;
    fVar37 = (tab_bar->BarRect).Min.y;
    (pIVar6->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar36;
    (pIVar6->DC).CursorPos.y = fVar37;
    (tab_bar->BarRect).Min.x = fVar44 + fVar36 + (tab_bar->BarRect).Min.x;
    local_58.x = (pIVar16->Style).Colors[0].x;
    local_58.y = (pIVar16->Style).Colors[0].y;
    uVar8 = (pIVar16->Style).Colors[0].z;
    uVar9 = (pIVar16->Style).Colors[0].w;
    local_58.w = (float)uVar9 * 0.5;
    local_58.z = (float)uVar8;
    PushStyleColor(0,&local_58);
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    local_88.w = 0.0;
    PushStyleColor(0x15,&local_88);
    bVar18 = BeginCombo("##v",(char *)0x0,0x50);
    PopStyleColor(2);
    if (bVar18) {
      iVar31 = (tab_bar->Tabs).Size;
      if (0 < iVar31) {
        lVar35 = 0;
        lVar24 = 0;
        pfVar26 = (float *)0x0;
        do {
          pIVar21 = (tab_bar->Tabs).Data;
          if ((*(byte *)((long)&pIVar21->Flags + lVar35 + 2) & 0x20) == 0) {
            local_88.x = 0.0;
            local_88.y = 0.0;
            bVar18 = Selectable((tab_bar->TabsNames).Buf.Data +
                                *(int *)((long)&pIVar21->NameOffset + lVar35),
                                tab_bar->SelectedTabId == *(ImGuiID *)((long)&pIVar21->ID + lVar35),
                                0,(ImVec2 *)&local_88);
            if (bVar18) {
              pfVar26 = (float *)((long)&pIVar21->ID + lVar35);
            }
            iVar31 = (tab_bar->Tabs).Size;
          }
          lVar24 = lVar24 + 1;
          lVar35 = lVar35 + 0x28;
        } while (lVar24 < iVar31);
        EndPopup();
        (pIVar6->DC).CursorPos = IVar39;
        iVar31 = local_c8._0_4_;
        if (pfVar26 != (float *)0x0) {
          fVar38 = *pfVar26;
          tab_bar->SelectedTabId = (ImGuiID)fVar38;
        }
        goto LAB_0016bc9c;
      }
      EndPopup();
      (pIVar6->DC).CursorPos = IVar39;
    }
    else {
      (pIVar6->DC).CursorPos = IVar39;
    }
    iVar31 = local_c8._0_4_;
  }
LAB_0016bc9c:
  local_ac[0] = 0;
  local_ac[1] = iVar31 + (int)fVar45;
  local_ac[2] = (int)fVar45;
  iVar31 = (tab_bar->Tabs).Size;
  iVar29 = (pIVar17->ShrinkWidthBuffer).Capacity;
  iVar30 = iVar31;
  if (iVar29 < iVar31) {
    if (iVar29 == 0) {
      iVar29 = 8;
    }
    else {
      iVar29 = iVar29 / 2 + iVar29;
    }
    if (iVar29 <= iVar31) {
      iVar29 = iVar31;
    }
    __dest = (ImGuiShrinkWidthItem *)MemAlloc((long)iVar29 << 3);
    pIVar7 = (pIVar17->ShrinkWidthBuffer).Data;
    if (pIVar7 != (ImGuiShrinkWidthItem *)0x0) {
      memcpy(__dest,pIVar7,(long)(pIVar17->ShrinkWidthBuffer).Size << 3);
      MemFree((pIVar17->ShrinkWidthBuffer).Data);
    }
    (pIVar17->ShrinkWidthBuffer).Data = __dest;
    (pIVar17->ShrinkWidthBuffer).Capacity = iVar29;
    iVar30 = (tab_bar->Tabs).Size;
  }
  (pIVar17->ShrinkWidthBuffer).Size = iVar31;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_c8._8_8_;
  local_c8 = auVar47 << 0x40;
  if (iVar30 < 1) {
    bVar18 = true;
    pfVar26 = (float *)0x0;
  }
  else {
    lVar24 = 0;
    lVar35 = 0;
    pfVar26 = (float *)0x0;
    bVar18 = false;
    iVar31 = -1;
    do {
      pIVar21 = (tab_bar->Tabs).Data;
      pfVar34 = (float *)((long)&pIVar21->ID + lVar24);
      if (((pfVar26 == (float *)0x0) ||
          ((int)pfVar26[3] < *(int *)((long)&pIVar21->LastFrameSelected + lVar24))) &&
         ((*(byte *)((long)&pIVar21->Flags + lVar24 + 2) & 0x20) == 0)) {
        pfVar26 = pfVar34;
      }
      fVar36 = *pfVar34;
      if (fVar36 == (float)tab_bar->SelectedTabId) {
        bVar18 = true;
      }
      if ((fVar38 == 0.0) && (fVar38 = fVar36, (float)pIVar17->NavJustMovedToId != fVar36)) {
        fVar38 = 0.0;
      }
      IVar39 = TabItemCalcSize((tab_bar->TabsNames).Buf.Data +
                               *(int *)((long)&pIVar21->NameOffset + lVar24),
                               (*(uint *)((long)&pIVar21->Flags + lVar24) >> 0x14 & 1) == 0);
      auVar47 = local_c8;
      fVar36 = IVar39.x;
      *(float *)((long)&pIVar21->ContentWidth + lVar24) = fVar36;
      uVar28 = *(uint *)((long)&pIVar21->Flags + lVar24);
      uVar23 = (ulong)(((char)uVar28 < '\0') + 1);
      if ((uVar28 & 0x40) != 0) {
        uVar23 = 0;
      }
      fVar44 = 0.0;
      if ((int)uVar23 == iVar31) {
        fVar44 = (pIVar17->Style).ItemInnerSpacing.x;
      }
      local_fc[uVar23 * 3 + 2] = fVar44 + fVar36 + local_fc[uVar23 * 3 + 2];
      iVar31 = local_ac[uVar23];
      local_ac[uVar23] = iVar31 + 1;
      pIVar7 = (pIVar17->ShrinkWidthBuffer).Data;
      pIVar7[iVar31].Index = (int)lVar35;
      pIVar7[iVar31].Width = fVar36;
      *(float *)((long)&pIVar21->Width + lVar24) = fVar36;
      lVar35 = lVar35 + 1;
      iVar29 = (tab_bar->Tabs).Size;
      lVar24 = lVar24 + 0x28;
      iVar31 = (int)uVar23;
    } while (lVar35 < iVar29);
    local_c8._1_7_ = 0;
    local_c8[0] = 1 < iVar29;
    local_c8._8_8_ = auVar47._8_8_;
    bVar18 = !bVar18;
  }
  fVar36 = 0.0;
  lVar24 = 8;
  do {
    fVar36 = fVar36 + *(float *)((long)local_fc + lVar24) + *(float *)((long)local_fc + lVar24 + 4);
    lVar24 = lVar24 + 0xc;
  } while (lVar24 != 0x2c);
  tab_bar->WidthAllTabsIdeal = fVar36;
  pIVar16 = GImGui;
  fVar44 = (tab_bar->BarRect).Max.x;
  if (((local_c8[0] & fVar44 - (tab_bar->BarRect).Min.x < fVar36) != 0) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar6 = GImGui->CurrentWindow;
    fVar44 = GImGui->FontSize + -2.0;
    local_68 = ZEXT416((uint)fVar44);
    fVar36 = (GImGui->Style).FramePadding.y;
    local_98 = ZEXT416((uint)(fVar36 + fVar36 + GImGui->FontSize));
    local_c8 = ZEXT416((uint)(fVar44 + fVar44));
    local_a0 = (pIVar6->DC).CursorPos;
    local_58.x = (GImGui->Style).Colors[0].x;
    local_58.y = (GImGui->Style).Colors[0].y;
    uVar10 = (GImGui->Style).Colors[0].z;
    uVar11 = (GImGui->Style).Colors[0].w;
    local_58.w = (float)uVar11 * 0.5;
    local_58.z = (float)uVar10;
    PushStyleColor(0,&local_58);
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    local_88.w = 0.0;
    PushStyleColor(0x15,&local_88);
    local_78._0_4_ = (pIVar16->IO).KeyRepeatDelay;
    local_78._4_4_ = (pIVar16->IO).KeyRepeatRate;
    (pIVar16->IO).KeyRepeatDelay = 0.25;
    (pIVar16->IO).KeyRepeatRate = 0.2;
    fVar36 = (tab_bar->BarRect).Min.x;
    fVar44 = (tab_bar->BarRect).Max.x - (float)local_c8._0_4_;
    uVar28 = -(uint)(fVar44 <= fVar36);
    local_48 = (float)(uVar28 & (uint)fVar36 | ~uVar28 & (uint)fVar44);
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    fVar36 = (tab_bar->BarRect).Min.y;
    (pIVar6->DC).CursorPos.x = local_48;
    (pIVar6->DC).CursorPos.y = fVar36;
    auVar41._0_8_ = local_68._0_8_;
    auVar41._12_4_ = local_68._12_4_;
    auVar41._8_4_ = local_68._4_4_;
    auVar40._8_8_ = auVar41._8_8_;
    IVar39.x = local_68._0_4_;
    IVar39.y = (float)local_98._0_4_;
    auVar40._0_4_ = IVar39.x;
    auVar40._4_4_ = local_98._0_4_;
    auVar42._0_12_ = auVar40._0_12_;
    auVar42._12_4_ = local_98._4_4_;
    local_98 = auVar42;
    bVar19 = ArrowButtonEx("##<",0,IVar39,0x410);
    fVar36 = (tab_bar->BarRect).Min.y;
    (pIVar6->DC).CursorPos.x = local_48 + (float)local_68._0_4_;
    (pIVar6->DC).CursorPos.y = fVar36;
    bVar20 = ArrowButtonEx("##>",1,(ImVec2)local_98._0_8_,0x410);
    iVar31 = -(uint)bVar19;
    if (bVar20) {
      iVar31 = 1;
    }
    PopStyleColor(2);
    (pIVar16->IO).KeyRepeatDelay = (float)(undefined4)local_78;
    (pIVar16->IO).KeyRepeatRate = (float)local_78._4_4_;
    if ((iVar31 != 0) && (tab_bar->SelectedTabId != 0)) {
      uVar28 = (tab_bar->Tabs).Size;
      if (0 < (int)uVar28) {
        pIVar21 = (tab_bar->Tabs).Data;
        uVar23 = 0;
        pIVar22 = pIVar21;
        do {
          if (pIVar22->ID == tab_bar->SelectedTabId) goto LAB_0016c3a5;
          uVar23 = uVar23 + 1;
          pIVar22 = pIVar22 + 1;
        } while (uVar28 != uVar23);
      }
    }
    (pIVar6->DC).CursorPos = local_a0;
    fVar44 = (tab_bar->BarRect).Max.x - ((float)local_c8._0_4_ + 1.0);
    (tab_bar->BarRect).Max.x = fVar44;
  }
LAB_0016c11a:
  fVar36 = local_fc[2] + local_fc[0] + uStack_e0._4_4_ + 0.0;
  fVar44 = fVar44 - (tab_bar->BarRect).Min.x;
  if (fVar36 < fVar44) {
    fVar37 = ((float)local_e8 + local_114) -
             ((fVar44 - (local_fc[2] + local_fc[0])) - (uStack_e0._4_4_ + 0.0));
    if (0.0 <= fVar37) goto LAB_0016c170;
  }
  else {
    fVar37 = fVar36 - fVar44;
LAB_0016c170:
    if ((0.0 < fVar37) && ((fVar44 <= fVar36 || ((tab_bar->Flags & 0x40U) != 0)))) {
      iVar31 = (int)local_70;
      if (fVar44 <= fVar36) {
        iVar31 = (int)uStack_e0 + (int)fVar45;
      }
      iVar29 = 0;
      if (fVar36 < fVar44) {
        iVar29 = (int)uStack_e0 + (int)fVar45;
      }
      lVar24 = (long)iVar29;
      ShrinkWidths((pIVar17->ShrinkWidthBuffer).Data + lVar24,iVar31,fVar37);
      if (0 < iVar31) {
        pIVar7 = (pIVar17->ShrinkWidthBuffer).Data;
        do {
          iVar30 = (int)pIVar7[lVar24].Width;
          if (-1 < iVar30) {
            pIVar21 = (tab_bar->Tabs).Data;
            iVar5 = pIVar7[lVar24].Index;
            fVar36 = (float)iVar30;
            lVar35 = (ulong)((char)pIVar21[iVar5].Flags < '\0') + 1;
            if ((pIVar21[iVar5].Flags & 0x40U) != 0) {
              lVar35 = 0;
            }
            local_fc[lVar35 * 3 + 2] = local_fc[lVar35 * 3 + 2] - (pIVar21[iVar5].Width - fVar36);
            pIVar21[iVar5].Width = fVar36;
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 < iVar29 + iVar31);
      }
    }
  }
  lVar24 = 0;
  fVar44 = 0.0;
  iVar31 = 0;
  fVar36 = 0.0;
  do {
    fVar37 = fVar44;
    if ((lVar24 == 2) &&
       (fVar37 = ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - local_fc[8],
       fVar37 = (float)(~-(uint)(fVar37 <= 0.0) & (uint)fVar37), fVar44 <= fVar37)) {
      fVar37 = fVar44;
    }
    fVar48 = local_fc[lVar24 * 3 + 1];
    if (0 < (long)(int)fVar48) {
      pfVar34 = &(tab_bar->Tabs).Data[iVar31].Width;
      uVar23 = 0;
      do {
        pfVar34[-1] = fVar37;
        fVar44 = 0.0;
        if (uVar23 < (int)fVar48 - 1) {
          fVar44 = (pIVar17->Style).ItemInnerSpacing.x;
        }
        fVar37 = fVar37 + fVar44 + *pfVar34;
        uVar23 = uVar23 + 1;
        pfVar34 = pfVar34 + 10;
      } while ((long)(int)fVar48 != uVar23);
    }
    fVar44 = local_fc[lVar24 * 3 + 2] + local_fc[lVar24 * 3 + 3];
    fVar36 = fVar36 + (float)(-(uint)(0.0 <= fVar44) & (uint)fVar44);
    fVar44 = fVar37 + local_fc[lVar24 * 3 + 3];
    iVar31 = (int)fVar48 + iVar31;
    lVar24 = lVar24 + 1;
  } while (lVar24 != 3);
  tab_bar->WidthAllTabs = fVar36;
  if (bVar18) {
    tab_bar->SelectedTabId = 0;
  }
  else {
    fVar44 = (float)tab_bar->SelectedTabId;
    if (fVar44 != 0.0) goto LAB_0016c35e;
  }
  fVar44 = 0.0;
  if ((tab_bar->NextSelectedTabId == 0) && (fVar44 = 0.0, pfVar26 != (float *)0x0)) {
    fVar38 = *pfVar26;
    tab_bar->SelectedTabId = (ImGuiID)fVar38;
    fVar44 = fVar38;
  }
LAB_0016c35e:
  tab_bar->VisibleTabId = (ImGuiID)fVar44;
  tab_bar->VisibleTabWasSubmitted = false;
  if (fVar38 != 0.0) {
    iVar31 = (tab_bar->Tabs).Size;
    if (0 < (long)iVar31) {
      pfVar26 = &((tab_bar->Tabs).Data)->Width;
      lVar24 = 0;
      do {
        if ((float)((ImGuiTabItem *)(pfVar26 + -5))->ID == fVar38) {
          if (((uint)pfVar26[-4] & 0xc0) != 0) break;
          fVar38 = GImGui->FontSize;
          fVar44 = (tab_bar->BarRect).Max.x;
          fVar37 = (tab_bar->BarRect).Min.x;
          fVar48 = fVar38;
          if ((int)lVar24 < (int)fVar45) {
            fVar48 = -0.0;
          }
          fVar48 = (pfVar26[-1] - local_fc[2]) - fVar48;
          if (iVar31 - (int)uStack_e0 <= (int)lVar24 + 1) {
            fVar38 = 1.0;
          }
          fVar38 = (pfVar26[-1] - local_fc[2]) + *pfVar26 + fVar38;
          tab_bar->ScrollingTargetDistToVisibility = 0.0;
          if ((fVar48 < tab_bar->ScrollingTarget) ||
             (fVar45 = (((fVar44 - fVar37) - local_fc[2]) - uStack_e0._4_4_) - local_114,
             fVar45 <= fVar38 - fVar48)) {
            fVar44 = tab_bar->ScrollingAnim - fVar38;
          }
          else {
            if (fVar38 - fVar45 <= tab_bar->ScrollingTarget) break;
            fVar44 = (fVar48 - fVar45) - tab_bar->ScrollingAnim;
            fVar48 = fVar38 - fVar45;
          }
          tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar44) & (uint)fVar44);
          tab_bar->ScrollingTarget = fVar48;
          break;
        }
        lVar24 = lVar24 + 1;
        pfVar26 = pfVar26 + 10;
      } while (iVar31 != lVar24);
    }
  }
  fVar45 = (tab_bar->BarRect).Min.x;
  fVar38 = (tab_bar->BarRect).Max.x;
  auVar43._0_4_ = fVar36 - (fVar38 - fVar45);
  uVar2 = tab_bar->ScrollingAnim;
  uVar3 = tab_bar->ScrollingTarget;
  auVar46._4_4_ = uVar3;
  auVar46._0_4_ = uVar2;
  auVar46._8_8_ = 0;
  auVar43._4_4_ = auVar43._0_4_;
  auVar43._8_4_ = auVar43._0_4_;
  auVar43._12_4_ = auVar43._0_4_;
  auVar47 = minps(auVar46,auVar43);
  fVar36 = (float)(-(uint)(0.0 <= auVar47._0_4_) & (uint)auVar47._0_4_);
  fVar44 = (float)(-(uint)(0.0 <= auVar47._4_4_) & (uint)auVar47._4_4_);
  tab_bar->ScrollingAnim = fVar36;
  tab_bar->ScrollingTarget = fVar44;
  if ((fVar36 != fVar44) || (NAN(fVar36) || NAN(fVar44))) {
    fVar37 = pIVar17->FontSize;
    fVar48 = fVar37 * 70.0;
    uVar28 = -(uint)(fVar48 <= tab_bar->ScrollingSpeed);
    fVar49 = ABS(fVar44 - fVar36) / 0.3;
    fVar48 = (float)(~uVar28 & (uint)fVar48 | (uint)tab_bar->ScrollingSpeed & uVar28);
    uVar28 = -(uint)(fVar49 <= fVar48);
    fVar49 = (float)(~uVar28 & (uint)fVar49 | uVar28 & (uint)fVar48);
    tab_bar->ScrollingSpeed = fVar49;
    fVar48 = fVar44;
    if ((pIVar17->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar37 * 10.0)) {
      fVar49 = fVar49 * (pIVar17->IO).DeltaTime;
      if (fVar44 <= fVar36) {
        fVar48 = fVar36;
        if (fVar44 < fVar36) {
          fVar36 = fVar36 - fVar49;
          uVar28 = -(uint)(fVar44 <= fVar36);
          fVar48 = (float)((uint)fVar36 & uVar28 | ~uVar28 & (uint)fVar44);
        }
      }
      else {
        fVar48 = fVar36 + fVar49;
        if (fVar44 <= fVar48) {
          fVar48 = fVar44;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar48;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  tab_bar->ScrollingRectMinX = local_fc[0] + fVar45 + local_fc[2];
  tab_bar->ScrollingRectMaxX = (fVar38 - uStack_e0._4_4_) - local_114;
  if ((tab_bar->Flags & 0x100000) == 0) {
    if ((tab_bar->TabsNames).Buf.Capacity < 0) {
      __dest_00 = (char *)MemAlloc(0);
      __src = (tab_bar->TabsNames).Buf.Data;
      if (__src != (char *)0x0) {
        memcpy(__dest_00,__src,(long)(tab_bar->TabsNames).Buf.Size);
        MemFree((tab_bar->TabsNames).Buf.Data);
      }
      (tab_bar->TabsNames).Buf.Data = __dest_00;
      (tab_bar->TabsNames).Buf.Capacity = 0;
    }
    (tab_bar->TabsNames).Buf.Size = 0;
  }
  pIVar6 = pIVar17->CurrentWindow;
  (pIVar6->DC).CursorPos = (tab_bar->BarRect).Min;
  local_58.y = (tab_bar->BarRect).Max.y - (tab_bar->BarRect).Min.y;
  local_58.x = tab_bar->WidthAllTabs;
  ItemSize((ImVec2 *)&local_58,(tab_bar->FramePadding).y);
  fVar38 = (tab_bar->BarRect).Min.x + tab_bar->WidthAllTabsIdeal;
  fVar45 = (pIVar6->DC).IdealMaxPos.x;
  uVar28 = -(uint)(fVar38 <= fVar45);
  (pIVar6->DC).IdealMaxPos.x = (float)(uVar28 & (uint)fVar45 | ~uVar28 & (uint)fVar38);
  return;
LAB_0016c3a5:
  do {
    uVar32 = (uint)uVar23;
    uVar25 = uVar32 + iVar31;
    uVar23 = (ulong)uVar25;
    if (uVar25 < uVar28) {
      uVar32 = uVar25;
    }
  } while (((pIVar21[(int)uVar32].Flags & 0x200000) != 0) && (uVar25 + iVar31 < uVar28));
  (pIVar6->DC).CursorPos = local_a0;
  fVar44 = (tab_bar->BarRect).Max.x - ((float)local_c8._0_4_ + 1.0);
  (tab_bar->BarRect).Max.x = fVar44;
  fVar38 = (float)pIVar21[(int)uVar32].ID;
  if ((pIVar21[(int)uVar32].Flags & 0x200000) == 0) {
    tab_bar->SelectedTabId = (ImGuiID)fVar38;
  }
  goto LAB_0016c11a;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect by compacting list
    // Detect if we need to sort out tab list (e.g. in rare case where a tab changed section)
    int tab_dst_n = 0;
    bool need_sort_by_section = false;
    ImGuiTabBarSection sections[3]; // Layout sections: Leading, Central, Trailing
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible || tab->WantClose)
        {
            // Remove tab
            if (tab_bar->VisibleTabId == tab->ID) { tab_bar->VisibleTabId = 0; }
            if (tab_bar->SelectedTabId == tab->ID) { tab_bar->SelectedTabId = 0; }
            if (tab_bar->NextSelectedTabId == tab->ID) { tab_bar->NextSelectedTabId = 0; }
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];

        tab = &tab_bar->Tabs[tab_dst_n];
        tab->IndexDuringLayout = (ImS16)tab_dst_n;

        // We will need sorting if tabs have changed section (e.g. moved from one of Leading/Central/Trailing to another)
        int curr_tab_section_n = TabItemGetSectionIdx(tab);
        if (tab_dst_n > 0)
        {
            ImGuiTabItem* prev_tab = &tab_bar->Tabs[tab_dst_n - 1];
            int prev_tab_section_n = TabItemGetSectionIdx(prev_tab);
            if (curr_tab_section_n == 0 && prev_tab_section_n != 0)
                need_sort_by_section = true;
            if (prev_tab_section_n == 2 && curr_tab_section_n != 2)
                need_sort_by_section = true;
        }

        sections[curr_tab_section_n].TabCount++;
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    if (need_sort_by_section)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerBySection);

    // Calculate spacing between sections
    sections[0].Spacing = sections[0].TabCount > 0 && (sections[1].TabCount + sections[2].TabCount) > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;
    sections[1].Spacing = sections[1].TabCount > 0 && sections[2].TabCount > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;

    // Setup next selected tab
    ImGuiID scroll_to_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_to_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (TabBarProcessReorder(tab_bar))
            if (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)
                scroll_to_tab_id = tab_bar->ReorderRequestTabId;
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Min.x!
            scroll_to_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Leading/Trailing tabs will be shrink only if central one aren't visible anymore, so layout the shrink data as: leading, trailing, central
    // (whereas our tabs are stored as: leading, central, trailing)
    int shrink_buffer_indexes[3] = { 0, sections[0].TabCount + sections[2].TabCount, sections[0].TabCount };
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);

    // Compute ideal tabs widths + store them into shrink buffer
    ImGuiTabItem* most_recently_selected_tab = NULL;
    int curr_section_n = -1;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if ((most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected) && !(tab->Flags & ImGuiTabItemFlags_Button))
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;
        if (scroll_to_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_to_tab_id = tab->ID;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        int section_n = TabItemGetSectionIdx(tab);
        ImGuiTabBarSection* section = &sections[section_n];
        section->Width += tab->ContentWidth + (section_n == curr_section_n ? g.Style.ItemInnerSpacing.x : 0.0f);
        curr_section_n = section_n;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        IM_MSVC_WARNING_SUPPRESS(6385);
        int shrink_buffer_index = shrink_buffer_indexes[section_n]++;
        g.ShrinkWidthBuffer[shrink_buffer_index].Index = tab_n;
        g.ShrinkWidthBuffer[shrink_buffer_index].Width = tab->ContentWidth;

        IM_ASSERT(tab->ContentWidth > 0.0f);
        tab->Width = tab->ContentWidth;
    }

    // Compute total ideal width (used for e.g. auto-resizing a window)
    tab_bar->WidthAllTabsIdeal = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
        tab_bar->WidthAllTabsIdeal += sections[section_n].Width + sections[section_n].Spacing;

    // Horizontal scrolling buttons
    // (note that TabBarScrollButtons() will alter BarRect.Max.x)
    if ((tab_bar->WidthAllTabsIdeal > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll))
        if (ImGuiTabItem* scroll_and_select_tab = TabBarScrollingButtons(tab_bar))
        {
            scroll_to_tab_id = scroll_and_select_tab->ID;
            if ((scroll_and_select_tab->Flags & ImGuiTabItemFlags_Button) == 0)
                tab_bar->SelectedTabId = scroll_to_tab_id;
        }

    // Shrink widths if full tabs don't fit in their allocated space
    float section_0_w = sections[0].Width + sections[0].Spacing;
    float section_1_w = sections[1].Width + sections[1].Spacing;
    float section_2_w = sections[2].Width + sections[2].Spacing;
    bool central_section_is_visible = (section_0_w + section_2_w) < tab_bar->BarRect.GetWidth();
    float width_excess;
    if (central_section_is_visible)
        width_excess = ImMax(section_1_w - (tab_bar->BarRect.GetWidth() - section_0_w - section_2_w), 0.0f); // Excess used to shrink central section
    else
        width_excess = (section_0_w + section_2_w) - tab_bar->BarRect.GetWidth(); // Excess used to shrink leading/trailing section

    // With ImGuiTabBarFlags_FittingPolicyScroll policy, we will only shrink leading/trailing if the central section is not visible anymore
    if (width_excess > 0.0f && ((tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown) || !central_section_is_visible))
    {
        int shrink_data_count = (central_section_is_visible ? sections[1].TabCount : sections[0].TabCount + sections[2].TabCount);
        int shrink_data_offset = (central_section_is_visible ? sections[0].TabCount + sections[2].TabCount : 0);
        ShrinkWidths(g.ShrinkWidthBuffer.Data + shrink_data_offset, shrink_data_count, width_excess);

        // Apply shrunk values into tabs and sections
        for (int tab_n = shrink_data_offset; tab_n < shrink_data_offset + shrink_data_count; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index];
            float shrinked_width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
            if (shrinked_width < 0.0f)
                continue;

            int section_n = TabItemGetSectionIdx(tab);
            sections[section_n].Width -= (tab->Width - shrinked_width);
            tab->Width = shrinked_width;
        }
    }

    // Layout all active tabs
    int section_tab_index = 0;
    float tab_offset = 0.0f;
    tab_bar->WidthAllTabs = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
    {
        ImGuiTabBarSection* section = &sections[section_n];
        if (section_n == 2)
            tab_offset = ImMin(ImMax(0.0f, tab_bar->BarRect.GetWidth() - section->Width), tab_offset);

        for (int tab_n = 0; tab_n < section->TabCount; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[section_tab_index + tab_n];
            tab->Offset = tab_offset;
            tab_offset += tab->Width + (tab_n < section->TabCount - 1 ? g.Style.ItemInnerSpacing.x : 0.0f);
        }
        tab_bar->WidthAllTabs += ImMax(section->Width + section->Spacing, 0.0f);
        tab_offset += section->Spacing;
        section_tab_index += section->TabCount;
    }

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_to_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_to_tab_id != 0)
        TabBarScrollToTab(tab_bar, scroll_to_tab_id, sections);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }
    tab_bar->ScrollingRectMinX = tab_bar->BarRect.Min.x + sections[0].Width + sections[0].Spacing;
    tab_bar->ScrollingRectMaxX = tab_bar->BarRect.Max.x - sections[2].Width - sections[1].Spacing;

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);

    // Actual layout in host window (we don't do it in BeginTabBar() so as not to waste an extra frame)
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos = tab_bar->BarRect.Min;
    ItemSize(ImVec2(tab_bar->WidthAllTabs, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
    window->DC.IdealMaxPos.x = ImMax(window->DC.IdealMaxPos.x, tab_bar->BarRect.Min.x + tab_bar->WidthAllTabsIdeal);
}